

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall wasm::Wasm2JSGlue::emitMemory(Wasm2JSGlue *this)

{
  size_type *psVar1;
  Expression *pEVar2;
  char *pcVar3;
  Wasm2JSGlue *pWVar4;
  uint uVar5;
  bool bVar6;
  pointer puVar7;
  ostream *poVar8;
  ulong uVar9;
  Global *pGVar10;
  undefined8 *puVar11;
  long *plVar12;
  Module *pMVar13;
  ulong uVar14;
  ulong uVar15;
  ulong *puVar16;
  long *plVar17;
  pointer puVar18;
  ulong uVar19;
  uint uVar20;
  undefined1 local_288 [392];
  ostream *local_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  undefined1 local_e0;
  undefined1 local_df;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  long *local_78;
  undefined8 local_70;
  long local_68;
  undefined8 uStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  Wasm2JSGlue *local_38;
  
  pMVar13 = this->wasm;
  bVar6 = needsBufferView(pMVar13);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>(&this->out->out,"  var bufferView;\n",0x12);
    pMVar13 = this->wasm;
  }
  puVar7 = (pMVar13->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar18 = (pMVar13->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar18) {
    do {
      if (((puVar7->_M_t).
           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
           super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
           super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->isPassive == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&this->out->out,"  var memorySegments = {};\n",0x1b);
        break;
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar18);
    std::__ostream_insert<char,std::char_traits<char>>
              (&this->out->out,
               "  var base64ReverseLookup = new Uint8Array(123/*\'z\'+1*/);\n  for (var i = 25; i >= 0; --i) {\n    base64ReverseLookup[48+i] = 52+i; // \'0-9\'\n    base64ReverseLookup[65+i] = i; // \'A-Z\'\n    base64ReverseLookup[97+i] = 26+i; // \'a-z\'\n  }\n  base64ReverseLookup[43] = 62; // \'+\'\n  base64ReverseLookup[47] = 63; // \'/\'\n  /** @noinline Inlining this function would mean expanding the base64 string 4x times in the source code, which Closure seems to be happy to do. */\n  function base64DecodeToExistingUint8Array(uint8Array, offset, b64) {\n    var b1, b2, i = 0, j = offset, bLength = b64.length, end = offset + (bLength*3>>2) - (b64[bLength-2] == \'=\') - (b64[bLength-1] == \'=\');\n    for (; i < bLength; i += 4) {\n      b1 = base64ReverseLookup[b64.charCodeAt(i+1)];\n      b2 = base64ReverseLookup[b64.charCodeAt(i+2)];\n      uint8Array[j++] = base64ReverseLookup[b64.charCodeAt(i)] << 2 | b1 >> 4;\n      if (j < end) uint8Array[j++] = b1 << 4 | b2 >> 2;\n      if (j < end) uint8Array[j++] = b2 << 6 | base64ReverseLookup[b64.charCodeAt(i+3)];\n    }"
               ,0x411);
    if (((this->wasm->features).features & 0x10) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&this->out->out,"\n    return uint8Array;",0x17);
    }
    std::__ostream_insert<char,std::char_traits<char>>(&this->out->out,"\n  }\n",5);
    pMVar13 = this->wasm;
    puVar7 = (pMVar13->dataSegments).
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar18 = (pMVar13->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_38 = this;
    if (puVar18 == puVar7) {
      uVar14 = 0;
    }
    else {
      uVar20 = 1;
      uVar19 = 0;
      do {
        if ((puVar7[uVar19]._M_t.
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
             super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->isPassive == true) {
          poVar8 = &this->out->out;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"memorySegments[",0xf);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"] = base64DecodeToExistingUint8Array(new Uint8Array(",0x34);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", 0, \"",6);
          base64Encode_abi_cxx11_
                    ((string *)local_288,
                     &(puVar7[uVar19]._M_t.
                       super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                       .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->data);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)local_288._0_8_,local_288._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\");\n",4);
          if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
            operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
          }
          pMVar13 = local_38->wasm;
          this = local_38;
        }
        uVar19 = (ulong)uVar20;
        puVar7 = (pMVar13->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar18 = (pMVar13->dataSegments).
                  super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar14 = (long)puVar18 - (long)puVar7 >> 3;
        uVar20 = uVar20 + 1;
      } while (uVar19 < uVar14);
    }
    if (puVar18 != puVar7) {
      uVar20 = 1;
      uVar19 = 0;
      do {
        bVar6 = (puVar7[uVar19]._M_t.
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->isPassive;
        if (bVar6 != true) break;
        uVar19 = (ulong)uVar20;
        uVar20 = uVar20 + 1;
      } while (uVar19 < uVar14);
      if (bVar6 == false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&this->out->out,"function initActiveSegments(imports) {\n",0x27);
        pMVar13 = this->wasm;
        puVar7 = (pMVar13->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pMVar13->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != puVar7) {
          uVar14 = 0;
          do {
            pWVar4 = local_38;
            if ((puVar7[uVar14]._M_t.
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->isPassive ==
                false) {
              local_100 = &local_38->out->out;
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_100,"  base64DecodeToExistingUint8Array(bufferView, ",0x2f);
              pEVar2 = (puVar7[uVar14]._M_t.
                        super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                        .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->offset;
              if (pEVar2->_id == '\n') {
                pGVar10 = Module::getGlobal(pWVar4->wasm,(Name)pEVar2[1]);
                local_e8 = 0x5b7374726f706d69;
                local_e0 = 0x27;
                local_f0 = 9;
                local_df = 0;
                pcVar3 = (pGVar10->super_Importable).module.super_IString.str._M_str;
                local_d8 = local_c8;
                local_f8 = &local_e8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_d8,pcVar3,
                           pcVar3 + (pGVar10->super_Importable).module.super_IString.str._M_len);
                uVar19 = 0xf;
                if (local_f8 != &local_e8) {
                  uVar19 = local_e8;
                }
                if (uVar19 < (ulong)(local_d0 + local_f0)) {
                  uVar19 = 0xf;
                  if (local_d8 != local_c8) {
                    uVar19 = local_c8[0];
                  }
                  if (uVar19 < (ulong)(local_d0 + local_f0)) goto LAB_00cea70a;
                  puVar11 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_d8,0,(char *)0x0,(ulong)local_f8);
                }
                else {
LAB_00cea70a:
                  puVar11 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d8);
                }
                local_78 = &local_68;
                plVar12 = puVar11 + 2;
                if ((long *)*puVar11 == plVar12) {
                  local_68 = *plVar12;
                  uStack_60 = puVar11[3];
                }
                else {
                  local_68 = *plVar12;
                  local_78 = (long *)*puVar11;
                }
                local_70 = puVar11[1];
                *puVar11 = plVar12;
                puVar11[1] = 0;
                *(undefined1 *)plVar12 = 0;
                plVar12 = (long *)std::__cxx11::string::append((char *)&local_78);
                local_98 = &local_88;
                puVar16 = (ulong *)(plVar12 + 2);
                if ((ulong *)*plVar12 == puVar16) {
                  local_88 = *puVar16;
                  uStack_80 = (undefined4)plVar12[3];
                  uStack_7c = *(undefined4 *)((long)plVar12 + 0x1c);
                }
                else {
                  local_88 = *puVar16;
                  local_98 = (ulong *)*plVar12;
                }
                local_90 = plVar12[1];
                *plVar12 = (long)puVar16;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                pcVar3 = (pGVar10->super_Importable).base.super_IString.str._M_str;
                local_b8 = local_a8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_b8,pcVar3,
                           pcVar3 + (pGVar10->super_Importable).base.super_IString.str._M_len);
                uVar19 = 0xf;
                if (local_98 != &local_88) {
                  uVar19 = local_88;
                }
                if (uVar19 < (ulong)(local_b0 + local_90)) {
                  uVar19 = 0xf;
                  if (local_b8 != local_a8) {
                    uVar19 = local_a8[0];
                  }
                  if (uVar19 < (ulong)(local_b0 + local_90)) goto LAB_00cea842;
                  puVar11 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
                }
                else {
LAB_00cea842:
                  puVar11 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8);
                }
                local_288._0_8_ = local_288 + 0x10;
                psVar1 = puVar11 + 2;
                if ((size_type *)*puVar11 == psVar1) {
                  local_288._16_8_ = *psVar1;
                  local_288._24_8_ = puVar11[3];
                }
                else {
                  local_288._16_8_ = *psVar1;
                  local_288._0_8_ = (size_type *)*puVar11;
                }
                local_288._8_8_ = puVar11[1];
                *puVar11 = psVar1;
                puVar11[1] = 0;
                *(char *)psVar1 = '\0';
                plVar12 = (long *)std::__cxx11::string::append(local_288);
                local_58 = &local_48;
                plVar17 = plVar12 + 2;
                if ((long *)*plVar12 == plVar17) {
                  local_48 = *plVar17;
                  lStack_40 = plVar12[3];
                }
                else {
                  local_48 = *plVar17;
                  local_58 = (long *)*plVar12;
                }
                local_50 = plVar12[1];
                *plVar12 = (long)plVar17;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
                  operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
                }
                if (local_b8 != local_a8) {
                  operator_delete(local_b8,local_a8[0] + 1);
                }
                if (local_98 != &local_88) {
                  operator_delete(local_98,local_88 + 1);
                }
                if (local_78 != &local_68) {
                  operator_delete(local_78,local_68 + 1);
                }
                poVar8 = local_100;
                if (local_d8 != local_c8) {
                  operator_delete(local_d8,local_c8[0] + 1);
                }
                if (local_f8 != &local_e8) {
                  operator_delete(local_f8,local_e8 + 1);
                }
              }
              else {
                if (pEVar2->_id != '\x0e') {
                  Fatal::Fatal((Fatal *)local_288);
                  Fatal::operator<<((Fatal *)local_288,
                                    (char (*) [43])"non-constant offsets aren\'t supported yet\n");
                  Fatal::~Fatal((Fatal *)local_288);
                }
                uVar9 = Literal::getInteger((Literal *)(pEVar2 + 1));
                uVar19 = -uVar9;
                if (0 < (long)uVar9) {
                  uVar19 = uVar9;
                }
                uVar20 = 1;
                if (9 < uVar19) {
                  uVar15 = uVar19;
                  uVar5 = 4;
                  do {
                    uVar20 = uVar5;
                    if (uVar15 < 100) {
                      uVar20 = uVar20 - 2;
                      goto LAB_00cea9c6;
                    }
                    if (uVar15 < 1000) {
                      uVar20 = uVar20 - 1;
                      goto LAB_00cea9c6;
                    }
                    if (uVar15 < 10000) goto LAB_00cea9c6;
                    bVar6 = 99999 < uVar15;
                    uVar15 = uVar15 / 10000;
                    uVar5 = uVar20 + 4;
                  } while (bVar6);
                  uVar20 = uVar20 + 1;
                }
LAB_00cea9c6:
                local_58 = &local_48;
                std::__cxx11::string::_M_construct
                          ((ulong)&local_58,(char)uVar20 - (char)((long)uVar9 >> 0x3f));
                std::__detail::__to_chars_10_impl<unsigned_long>
                          ((char *)((long)local_58 - ((long)uVar9 >> 0x3f)),uVar20,uVar19);
                poVar8 = local_100;
              }
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(char *)local_58,local_50);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,", \"",3);
              base64Encode_abi_cxx11_
                        ((string *)local_288,
                         &(puVar7[uVar14]._M_t.
                           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                           .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->data);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(char *)local_288._0_8_,local_288._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\");\n",4);
              if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
                operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
              }
              if (local_58 != &local_48) {
                operator_delete(local_58,local_48 + 1);
              }
              pMVar13 = local_38->wasm;
            }
            uVar14 = (ulong)((int)uVar14 + 1);
            puVar7 = (pMVar13->dataSegments).
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar14 < (ulong)((long)(pMVar13->dataSegments).
                                          super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7
                                   >> 3));
        }
        std::__ostream_insert<char,std::char_traits<char>>(&local_38->out->out,"}\n",2);
      }
    }
  }
  return;
}

Assistant:

void Wasm2JSGlue::emitMemory() {
  if (needsBufferView(wasm)) {
    // Create a helper bufferView to access the buffer if we need one. We use it
    // for creating memory segments if we have any (we may not if the segments
    // are shipped in a side .mem file, for example), and also in bulk memory
    // operations.
    // This will get assigned during `asmFunc` (and potentially re-assigned
    // during __wasm_memory_grow).
    // TODO: We should probably just share a single HEAPU8 var.
    out << "  var bufferView;\n";
  }

  // If there are no memory segments, we don't need to emit any support code for
  // segment creation.
  if (wasm.dataSegments.empty()) {
    return;
  }

  // If we have passive memory segments, we need to store those.
  for (auto& seg : wasm.dataSegments) {
    if (seg->isPassive) {
      out << "  var memorySegments = {};\n";
      break;
    }
  }

  out <<
    R"(  var base64ReverseLookup = new Uint8Array(123/*'z'+1*/);
  for (var i = 25; i >= 0; --i) {
    base64ReverseLookup[48+i] = 52+i; // '0-9'
    base64ReverseLookup[65+i] = i; // 'A-Z'
    base64ReverseLookup[97+i] = 26+i; // 'a-z'
  }
  base64ReverseLookup[43] = 62; // '+'
  base64ReverseLookup[47] = 63; // '/'
  /** @noinline Inlining this function would mean expanding the base64 string 4x times in the source code, which Closure seems to be happy to do. */
  function base64DecodeToExistingUint8Array(uint8Array, offset, b64) {
    var b1, b2, i = 0, j = offset, bLength = b64.length, end = offset + (bLength*3>>2) - (b64[bLength-2] == '=') - (b64[bLength-1] == '=');
    for (; i < bLength; i += 4) {
      b1 = base64ReverseLookup[b64.charCodeAt(i+1)];
      b2 = base64ReverseLookup[b64.charCodeAt(i+2)];
      uint8Array[j++] = base64ReverseLookup[b64.charCodeAt(i)] << 2 | b1 >> 4;
      if (j < end) uint8Array[j++] = b1 << 4 | b2 >> 2;
      if (j < end) uint8Array[j++] = b2 << 6 | base64ReverseLookup[b64.charCodeAt(i+3)];
    })";
  if (wasm.features.hasBulkMemory()) {
    // Passive segments in bulk memory are initialized into new arrays that are
    // passed into here, and we need to return them.
    out << R"(
    return uint8Array;)";
  }
  out << R"(
  }
)";

  for (Index i = 0; i < wasm.dataSegments.size(); i++) {
    auto& seg = wasm.dataSegments[i];
    if (seg->isPassive) {
      // Fancy passive segments are decoded into typed arrays on the side, for
      // later copying.
      out << "memorySegments[" << i
          << "] = base64DecodeToExistingUint8Array(new Uint8Array("
          << seg->data.size() << ")"
          << ", 0, \"" << base64Encode(seg->data) << "\");\n";
    }
  }

  if (hasActiveSegments(wasm)) {
    auto globalOffset = [&](const DataSegment& segment) {
      if (auto* c = segment.offset->dynCast<Const>()) {
        return std::to_string(c->value.getInteger());
      }
      if (auto* get = segment.offset->dynCast<GlobalGet>()) {
        auto internalName = get->name;
        auto importedGlobal = wasm.getGlobal(internalName);
        return std::string("imports['") + importedGlobal->module.toString() +
               "']['" + importedGlobal->base.toString() + "']";
      }
      Fatal() << "non-constant offsets aren't supported yet\n";
    };

    out << "function initActiveSegments(imports) {\n";
    for (Index i = 0; i < wasm.dataSegments.size(); i++) {
      auto& seg = wasm.dataSegments[i];
      if (!seg->isPassive) {
        // Plain active segments are decoded directly into the main memory.
        out << "  base64DecodeToExistingUint8Array(bufferView, "
            << globalOffset(*seg) << ", \"" << base64Encode(seg->data)
            << "\");\n";
      }
    }
    out << "}\n";
  }
}